

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

int cond(LexState *ls)

{
  expdesc v;
  expdesc local_28;
  
  subexpr(ls,&local_28,0);
  if (local_28.k == VNIL) {
    local_28.k = VFALSE;
  }
  luaK_goiftrue(ls->fs,&local_28);
  return local_28.f;
}

Assistant:

static int cond(LexState *ls) {
    /* cond -> exp */
    expdesc v;
    expr(ls, &v);  /* read condition */
    if (v.k == VNIL) v.k = VFALSE;  /* 'falses' are all equal here */
    luaK_goiftrue(ls->fs, &v);
    return v.f;
}